

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::setOpacity(QPainter *this,qreal opacity)

{
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var1;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> uVar2;
  long in_FS_OFFSET;
  double dVar3;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var1._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning(local_28,"QPainter::setOpacity: Painter not active");
  }
  else {
    if (opacity <= 0.0) {
      opacity = 0.0;
    }
    dVar3 = 1.0;
    if (opacity <= 1.0) {
      dVar3 = opacity;
    }
    uVar2._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl = ((_Var1._M_head_impl)->state)._M_t;
    if ((dVar3 != *(double *)
                   ((long)uVar2._M_t.
                          super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                          .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x198)) ||
       (NAN(dVar3) ||
        NAN(*(double *)
             ((long)uVar2._M_t.
                    super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x198)))) {
      *(double *)
       ((long)uVar2._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
              _M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
              super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x198) = dVar3;
      if ((_Var1._M_head_impl)->extended != (QPaintEngineEx *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->extended->super_QPaintEngine + 0x120))();
          return;
        }
        goto LAB_003831fd;
      }
      *(byte *)((long)uVar2._M_t.
                      super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t
                      .super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 9) =
           *(byte *)((long)uVar2._M_t.
                           super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                           .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 9) | 0x10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_003831fd:
  __stack_chk_fail();
}

Assistant:

void QPainter::setOpacity(qreal opacity)
{
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::setOpacity: Painter not active");
        return;
    }

    opacity = qMin(qreal(1), qMax(qreal(0), opacity));

    if (opacity == d->state->opacity)
        return;

    d->state->opacity = opacity;

    if (d->extended)
        d->extended->opacityChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyOpacity;
}